

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mau.cpp
# Opt level: O0

MauResult mau_proxy_destroy(MauProxy proxy)

{
  ProxySession *in_RDI;
  ProxySession *session;
  MauResult result;
  ProxySession *in_stack_000000d0;
  undefined4 local_c;
  
  local_c = Mau_Success;
  if (in_RDI != (ProxySession *)0x0) {
    local_c = mau::ProxySession::GetLastResult((ProxySession *)0x1075dd);
    mau::ProxySession::Shutdown(in_stack_000000d0);
    if (in_RDI != (ProxySession *)0x0) {
      mau::ProxySession::~ProxySession(in_RDI);
      operator_delete(in_RDI);
    }
    DecrementLoggerRefs();
  }
  return local_c;
}

Assistant:

MAU_EXPORT MauResult mau_proxy_destroy(
    MauProxy proxy ///< [in] Proxy to shutdown
)
{
    MauResult result = Mau_Success;

    auto session = reinterpret_cast<ProxySession*>(proxy);
    if (session)
    {
        result = session->GetLastResult();

        session->Shutdown();

        // Object goes out of scope here----------------------------------------
        delete session;

        DecrementLoggerRefs();
    }

    return result;
}